

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::Commissioner::GeneratePSKc
                  (Error *__return_storage_ptr__,ByteArray *aPSKc,string *aPassphrase,
                  string *aNetworkName,ByteArray *aExtendedPanId)

{
  char cVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  uint8_t *aKey;
  char *pcVar2;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  ByteArray salt;
  string local_e8;
  undefined1 local_c8 [16];
  char *local_b8;
  size_t local_b0;
  format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *local_a8;
  format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *local_a0;
  code *local_98;
  code *pcStack_90;
  code *local_88;
  writer write;
  string saltPrefix;
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&saltPrefix,"Thread",(allocator *)local_c8);
  salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (aPassphrase->_M_string_length - 6 < 0xfa) {
    if (aNetworkName->_M_string_length < 0x11) {
      if ((long)(aExtendedPanId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(aExtendedPanId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start == 8) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&salt,(const_iterator)0x0,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )saltPrefix._M_dataplus._M_p,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(saltPrefix._M_dataplus._M_p + saltPrefix._M_string_length));
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&salt,
                   (const_iterator)
                   salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(aExtendedPanId->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(aExtendedPanId->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
        __first._M_current = (aNetworkName->_M_dataplus)._M_p;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&salt,
                   (const_iterator)
                   salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,__first,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(__first._M_current + aNetworkName->_M_string_length));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aPSKc,0x10);
        aKey = (aPSKc->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
        otPbkdf2Cmac((uint8_t *)(aPassphrase->_M_dataplus)._M_p,
                     (uint16_t)aPassphrase->_M_string_length,
                     salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (short)salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (short)salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,0x4000,
                     (short)*(undefined4 *)
                             &(aPSKc->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (short)aKey,aKey);
        goto LAB_00190526;
      }
      local_c8._0_4_ = ulong_long_type;
      local_c8._4_4_ = ulong_long_type;
      local_c8._8_8_ = "extended PAN ID length={} != {}";
      local_b8 = (char *)0x1f;
      local_b0 = 0x200000000;
      local_a0 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      local_98 = ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      pcVar2 = "extended PAN ID length={} != {}";
      local_a8 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 local_c8;
      while (pcVar3 = pcVar2, pcVar3 != "") {
        pcVar2 = pcVar3 + 1;
        if (*pcVar3 == '}') {
          if ((pcVar2 == "") || (*pcVar2 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar2 = pcVar3 + 2;
        }
        else if (*pcVar3 == '{') {
          pcVar2 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,unsigned_long>&>
                             (pcVar3,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                               *)local_c8);
        }
      }
      local_c8._0_8_ =
           (long)(aExtendedPanId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(aExtendedPanId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
      local_b8 = (char *)0x8;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_c8;
      fmt_01.size_ = 0x44;
      fmt_01.data_ = (char *)0x1f;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e8,(v10 *)"extended PAN ID length={} != {}",fmt_01,args_01);
      local_58._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_e8);
    }
    else {
      local_c8._0_4_ = ulong_long_type;
      local_c8._4_4_ = ulong_long_type;
      local_c8._8_8_ = "network name length={} > {}";
      local_b8 = (char *)0x1b;
      local_b0 = 0x200000000;
      local_a0 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      local_98 = ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      pcVar2 = "network name length={} > {}";
      local_a8 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 local_c8;
      while (pcVar3 = pcVar2, pcVar3 != "") {
        pcVar2 = pcVar3 + 1;
        if (*pcVar3 == '}') {
          if ((pcVar2 == "") || (*pcVar2 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar2 = pcVar3 + 2;
        }
        else if (*pcVar3 == '{') {
          pcVar2 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,unsigned_long>&>
                             (pcVar3,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                               *)local_c8);
        }
      }
      local_c8._0_8_ = aNetworkName->_M_string_length;
      local_b8 = (char *)0x10;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_c8;
      fmt_00.size_ = 0x44;
      fmt_00.data_ = (char *)0x1b;
      ::fmt::v10::vformat_abi_cxx11_(&local_e8,(v10 *)"network name length={} > {}",fmt_00,args_00);
      local_58._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_e8);
    }
  }
  else {
    local_c8._0_4_ = ulong_long_type;
    local_c8._4_4_ = ulong_long_type;
    local_c8._8_4_ = 4;
    local_b8 = "passphrase length={} exceeds range [{}, {}]";
    local_b0 = 0x2b;
    local_a8 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
               0x300000000;
    local_98 = ::fmt::v10::detail::
               parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    pcStack_90 = ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    local_88 = ::fmt::v10::detail::
               parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    pcVar2 = "passphrase length={} exceeds range [{}, {}]";
    local_a0 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_c8;
    write.handler_ =
         (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_c8;
    while (pcVar2 != "") {
      cVar1 = *pcVar2;
      pcVar3 = pcVar2;
      while (cVar1 != '{') {
        pcVar3 = pcVar3 + 1;
        if (pcVar3 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>_>
          ::writer::operator()(&write,pcVar2,"");
          goto LAB_001902ed;
        }
        cVar1 = *pcVar3;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>_>
      ::writer::operator()(&write,pcVar2,pcVar3);
      pcVar2 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,unsigned_long,unsigned_long>&>
                         (pcVar3,"",
                          (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>
                           *)local_c8);
    }
LAB_001902ed:
    local_c8._0_8_ = aPassphrase->_M_string_length;
    local_b8 = (char *)0x6;
    local_a8 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)0xff;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_c8;
    fmt.size_ = 0x444;
    fmt.data_ = (char *)0x2b;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_e8,(v10 *)"passphrase length={} exceeds range [{}, {}]",fmt,args);
    local_58._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_e8);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_e8);
LAB_00190526:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&saltPrefix);
  return __return_storage_ptr__;
}

Assistant:

Error Commissioner::GeneratePSKc(ByteArray         &aPSKc,
                                 const std::string &aPassphrase,
                                 const std::string &aNetworkName,
                                 const ByteArray   &aExtendedPanId)
{
    Error             error;
    const std::string saltPrefix = "Thread";
    ByteArray         salt;

    VerifyOrExit((aPassphrase.size() >= kMinCommissionerCredentialLength) &&
                     (aPassphrase.size() <= kMaxCommissionerCredentialLength),
                 error = ERROR_INVALID_ARGS("passphrase length={} exceeds range [{}, {}]", aPassphrase.size(),
                                            kMinCommissionerCredentialLength, kMaxCommissionerCredentialLength));
    VerifyOrExit(aNetworkName.size() <= kMaxNetworkNameLength,
                 error = ERROR_INVALID_ARGS("network name length={} > {}", aNetworkName.size(), kMaxNetworkNameLength));
    VerifyOrExit(
        aExtendedPanId.size() == kExtendedPanIdLength,
        error = ERROR_INVALID_ARGS("extended PAN ID length={} != {}", aExtendedPanId.size(), kExtendedPanIdLength));

    salt.insert(salt.end(), saltPrefix.begin(), saltPrefix.end());
    salt.insert(salt.end(), aExtendedPanId.begin(), aExtendedPanId.end());
    salt.insert(salt.end(), aNetworkName.begin(), aNetworkName.end());

    aPSKc.resize(kMaxPSKcLength);
    otPbkdf2Cmac(reinterpret_cast<const uint8_t *>(aPassphrase.data()), static_cast<uint16_t>(aPassphrase.size()),
                 salt.data(), static_cast<uint16_t>(salt.size()), 16384, static_cast<uint16_t>(aPSKc.size()),
                 aPSKc.data());

exit:
    return error;
}